

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Result __thiscall
testing::internal::FunctionMocker<const_solitaire::colliders::interfaces::StockPileCollider_&()>::
Invoke(FunctionMocker<const_solitaire::colliders::interfaces::StockPileCollider_&()> *this)

{
  UntypedActionResultHolderBase *f;
  ActionResultHolder<const_solitaire::colliders::interfaces::StockPileCollider_&> *__p;
  pointer this_00;
  StockPileCollider *pSVar1;
  unique_ptr<testing::internal::ActionResultHolder<const_solitaire::colliders::interfaces::StockPileCollider_&>,_std::default_delete<testing::internal::ActionResultHolder<const_solitaire::colliders::interfaces::StockPileCollider_&>_>_>
  local_20;
  unique_ptr<testing::internal::ActionResultHolder<const_solitaire::colliders::interfaces::StockPileCollider_&>,_std::default_delete<testing::internal::ActionResultHolder<const_solitaire::colliders::interfaces::StockPileCollider_&>_>_>
  holder;
  ArgumentTuple tuple;
  FunctionMocker<const_solitaire::colliders::interfaces::StockPileCollider_&()> *this_local;
  
  holder._M_t.
  super___uniq_ptr_impl<testing::internal::ActionResultHolder<const_solitaire::colliders::interfaces::StockPileCollider_&>,_std::default_delete<testing::internal::ActionResultHolder<const_solitaire::colliders::interfaces::StockPileCollider_&>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ActionResultHolder<const_solitaire::colliders::interfaces::StockPileCollider_&>_*,_std::default_delete<testing::internal::ActionResultHolder<const_solitaire::colliders::interfaces::StockPileCollider_&>_>_>
  .
  super__Head_base<0UL,_testing::internal::ActionResultHolder<const_solitaire::colliders::interfaces::StockPileCollider_&>_*,_false>
  ._M_head_impl._7_1_ = 0;
  f = UntypedFunctionMockerBase::UntypedInvokeWith
                (&this->super_UntypedFunctionMockerBase,
                 (void *)((long)&holder._M_t.
                                 super___uniq_ptr_impl<testing::internal::ActionResultHolder<const_solitaire::colliders::interfaces::StockPileCollider_&>,_std::default_delete<testing::internal::ActionResultHolder<const_solitaire::colliders::interfaces::StockPileCollider_&>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_testing::internal::ActionResultHolder<const_solitaire::colliders::interfaces::StockPileCollider_&>_*,_std::default_delete<testing::internal::ActionResultHolder<const_solitaire::colliders::interfaces::StockPileCollider_&>_>_>
                                 .
                                 super__Head_base<0UL,_testing::internal::ActionResultHolder<const_solitaire::colliders::interfaces::StockPileCollider_&>_*,_false>
                                 ._M_head_impl + 7));
  __p = DownCast_<testing::internal::ActionResultHolder<solitaire::colliders::interfaces::StockPileCollider_const&>*,testing::internal::UntypedActionResultHolderBase>
                  (f);
  std::
  unique_ptr<testing::internal::ActionResultHolder<solitaire::colliders::interfaces::StockPileCollider_const&>,std::default_delete<testing::internal::ActionResultHolder<solitaire::colliders::interfaces::StockPileCollider_const&>>>
  ::
  unique_ptr<std::default_delete<testing::internal::ActionResultHolder<solitaire::colliders::interfaces::StockPileCollider_const&>>,void>
            ((unique_ptr<testing::internal::ActionResultHolder<solitaire::colliders::interfaces::StockPileCollider_const&>,std::default_delete<testing::internal::ActionResultHolder<solitaire::colliders::interfaces::StockPileCollider_const&>>>
              *)&local_20,__p);
  this_00 = std::
            unique_ptr<testing::internal::ActionResultHolder<const_solitaire::colliders::interfaces::StockPileCollider_&>,_std::default_delete<testing::internal::ActionResultHolder<const_solitaire::colliders::interfaces::StockPileCollider_&>_>_>
            ::operator->(&local_20);
  pSVar1 = ActionResultHolder<const_solitaire::colliders::interfaces::StockPileCollider_&>::Unwrap
                     (this_00);
  std::
  unique_ptr<testing::internal::ActionResultHolder<const_solitaire::colliders::interfaces::StockPileCollider_&>,_std::default_delete<testing::internal::ActionResultHolder<const_solitaire::colliders::interfaces::StockPileCollider_&>_>_>
  ::~unique_ptr(&local_20);
  return pSVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }